

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_from_mext(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg2;
  int32_t val;
  TCGv_i32 local_40;
  TCGv_i32 acc;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((insn & 8) == 0) {
    local_40 = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  }
  else {
    local_40 = get_areg(s,insn & 7);
  }
  val = 0;
  if ((insn & 0x400) != 0) {
    val = 2;
  }
  arg2 = tcg_const_i32_m68k(tcg_ctx_00,val);
  if ((s->env->macsr & 0x20) == 0) {
    gen_helper_get_mac_exti(tcg_ctx_00,local_40,tcg_ctx_00->cpu_env,arg2);
  }
  else {
    gen_helper_get_mac_extf(tcg_ctx_00,local_40,tcg_ctx_00->cpu_env,arg2);
  }
  return;
}

Assistant:

DISAS_INSN(from_mext)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv acc;
    reg = (insn & 8) ? AREG(insn, 0) : DREG(insn, 0);
    acc = tcg_const_i32(tcg_ctx, (insn & 0x400) ? 2 : 0);
    if (s->env->macsr & MACSR_FI)
        gen_helper_get_mac_extf(tcg_ctx, reg, tcg_ctx->cpu_env, acc);
    else
        gen_helper_get_mac_exti(tcg_ctx, reg, tcg_ctx->cpu_env, acc);
}